

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportBuildFileGenerator *this,string *config)

{
  cmGeneratorTarget *this_00;
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string se;
  string fileName;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  char local_490;
  undefined7 uStack_48f;
  long local_488;
  long local_480 [2];
  string local_470;
  long *local_450;
  long local_448;
  long local_440 [2];
  string local_430;
  undefined1 local_410 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400 [6];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  undefined8 local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  byte local_278 [8];
  long *local_270;
  undefined8 local_268;
  char *local_260;
  size_type local_258;
  pointer local_250;
  undefined8 local_248;
  char *local_240;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(&local_450);
  if (local_448 == 0) {
    bVar4 = true;
  }
  else {
    local_258 = config->_M_string_length;
    if (local_258 == 0) {
      std::__cxx11::string::_M_replace((ulong)config,0,(char *)0x0,0x7a23a4);
      local_258 = config->_M_string_length;
    }
    local_298._8_8_ = (this->super_cmExportFileGenerator).FileDir._M_dataplus._M_p;
    local_298._0_8_ = (this->super_cmExportFileGenerator).FileDir._M_string_length;
    local_410._8_8_ = local_400;
    local_410._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    local_400[0]._M_local_buf[0] = '/';
    local_288 = 1;
    local_270 = local_450;
    local_268 = 0xd;
    local_260 = "/cxx-modules-";
    local_250 = (config->_M_dataplus)._M_p;
    local_248 = 6;
    local_240 = ".cmake";
    views._M_len = 6;
    views._M_array = (iterator)local_298;
    local_280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410._8_8_;
    cmCatViews_abi_cxx11_(&local_470,views);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_470,true,None);
    bVar4 = (local_278[(long)*(_func_int **)(local_298._0_8_ + -0x18)] & 5) == 0;
    if (bVar4) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
      p_Var2 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      p_Var3 = &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var2 != p_Var3) {
        do {
          this_00 = *(cmGeneratorTarget **)(p_Var2 + 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"include(\"${CMAKE_CURRENT_LIST_DIR}/target-",0x2a);
          cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_410,this_00);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,(char *)local_410._0_8_,local_410._8_8_);
          local_490 = '-';
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_490,1);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar1,(config->_M_dataplus)._M_p,config->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,".cmake\")\n",9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._0_8_ != local_400) {
            operator_delete((void *)local_410._0_8_,
                            CONCAT71(local_400[0]._M_allocated_capacity._1_7_,
                                     local_400[0]._M_local_buf[0]) + 1);
          }
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        } while ((_Rb_tree_header *)p_Var2 != p_Var3);
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_410,"cannot write to file \"",0x16);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_410,local_470._M_dataplus._M_p,local_470._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)CONCAT71(uStack_48f,local_490),local_488);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_430);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
      if ((long *)CONCAT71(uStack_48f,local_490) != local_480) {
        operator_delete((long *)CONCAT71(uStack_48f,local_490),local_480[0] + 1);
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_450 != local_440) {
    operator_delete(local_450,local_440[0] + 1);
  }
  return bVar4;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion(
  std::string config) const
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  if (config.empty()) {
    config = "noconfig";
  }

  std::string fileName = cmStrCat(this->FileDir, '/', cxx_modules_dirname,
                                  "/cxx-modules-", config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  for (auto const* tgt : this->ExportedTargets) {
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/target-" << tgt->GetExportName()
       << '-' << config << ".cmake\")\n";
  }

  return true;
}